

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  decimal_fp<double> *pdVar1;
  int iVar2;
  locale_ref lVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  type tVar7;
  type tVar8;
  appender aVar9;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  sign_t sVar18;
  locale_ref in_stack_fffffffffffffee8;
  char local_10b;
  sign_t sign;
  char zero;
  bool pointy;
  undefined3 uStack_107;
  int significand_size;
  ulong local_100;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_f8;
  undefined8 local_f0;
  basic_format_specs<char> *local_e8;
  ulong local_e0;
  significand_type significand;
  int local_d0;
  int exp;
  locale_ref local_c8;
  significand_type local_c0;
  float_specs fspecs_local;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = f->significand;
  local_f8 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  local_f0 = f;
  local_e8 = specs;
  local_c0 = significand;
  fspecs_local = fspecs;
  iVar6 = get_significand_size<double>(f);
  zero = '0';
  sVar18 = fspecs._5_1_;
  sign = sVar18;
  significand_size = iVar6;
  tVar7 = to_unsigned<int>(iVar6);
  local_100 = (ulong)((tVar7 + 1) - (uint)(sVar18 == none));
  cVar4 = '.';
  local_e0 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) != 0) {
    cVar4 = decimal_point_impl<char>(in_stack_fffffffffffffee8);
  }
  pdVar1 = local_f0;
  iVar12 = local_f0->exponent;
  local_d0 = iVar6 + iVar12 + -1;
  local_10b = cVar4;
  local_c8.locale_ = loc.locale_;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_d0;
  bVar5 = do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<double>,_char,_fmt::v9::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  lVar3 = local_c8;
  uVar15 = local_100;
  uVar14 = fspecs.precision;
  uVar11 = (uint)local_e0;
  if (bVar5) {
    iVar12 = iVar12 + iVar6;
    if ((uVar11 >> 0x13 & 1) == 0) {
      local_f0 = (decimal_fp<double> *)((ulong)local_f0._4_4_ << 0x20);
      if (iVar6 == 1) {
        cVar4 = '\0';
      }
    }
    else {
      iVar13 = 0;
      if (0 < (int)(uVar14 - iVar6)) {
        iVar13 = uVar14 - iVar6;
      }
      local_f0 = (decimal_fp<double> *)CONCAT44(local_f0._4_4_,iVar13);
      tVar7 = to_unsigned<int>(iVar13);
      uVar15 = local_100 + tVar7;
    }
    iVar2 = local_d0;
    iVar13 = 1 - iVar12;
    if (0 < iVar12) {
      iVar13 = local_d0;
    }
    iVar12 = 2;
    if (99 < iVar13) {
      iVar12 = (999 < iVar13) + 3;
    }
    tVar7 = to_unsigned<int>((3 - (uint)(cVar4 == '\0')) + iVar12);
    write.sign = sVar18;
    write.significand = local_c0;
    write.decimal_point = cVar4;
    write.significand_size = iVar6;
    write._24_5_ = CONCAT14('0',(int)local_f0);
    write._24_8_ = CONCAT26(write._30_2_,CONCAT15(((uVar11 >> 0x10 & 1) == 0) << 5,write._24_5_)) |
                   0x450000000000;
    write.output_exp = iVar2;
    if (0 < local_e8->width) {
      aVar9 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)local_f8.container,local_e8,uVar15 + tVar7,&write);
      return (appender)
             aVar9.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    aVar9 = do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<double>,_char,_fmt::v9::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()(&write,(iterator)local_f8.container);
    return (appender)
           aVar9.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  iVar13 = pdVar1->exponent;
  iVar12 = iVar6 + iVar13;
  exp = iVar12;
  if (iVar13 < 0) {
    if (iVar12 < 1) {
      uVar16 = -iVar12;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar16;
      if (uVar14 < uVar16) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar14;
      }
      if ((int)uVar14 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar16;
      }
      if (iVar6 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar16;
      }
      if (iVar6 == 0 && (uint)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        _pointy = CONCAT31(uStack_107,(char)((uVar11 & 0x80000) >> 0x13));
        if ((local_e0 & 0x80000) == 0) {
          iVar6 = 1;
          goto LAB_001cc7dc;
        }
      }
      else {
        _pointy = CONCAT31(uStack_107,1);
      }
      iVar6 = 2;
LAB_001cc7dc:
      tVar7 = to_unsigned<int>((uint)grouping.sep_.grouping._M_dataplus._M_p);
      write._0_8_ = &sign;
      write.significand = (significand_type)&zero;
      write._16_8_ = &pointy;
      write._24_8_ = &local_10b;
      write._32_8_ = &grouping;
      aVar9 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>
                        ((appender)local_f8.container,local_e8,(iVar6 + tVar7) + uVar15,
                         (anon_class_56_7_162c6e41 *)&write);
      return (appender)
             aVar9.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    _pointy = uVar14 - iVar6 & (int)(uVar11 << 0xc) >> 0x1f;
    uVar14 = _pointy;
    if ((int)_pointy < 1) {
      uVar14 = 0;
    }
    tVar7 = to_unsigned<int>(uVar14);
    digit_grouping<char>::digit_grouping(&grouping,lVar3,(bool)((byte)(uVar11 >> 0x11) & 1));
    iVar6 = digit_grouping<char>::count_separators(&grouping,significand_size);
    tVar8 = to_unsigned<int>(iVar6);
    write._0_8_ = &sign;
    write.significand = (significand_type)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = &exp;
    write._32_8_ = &local_10b;
    bVar10.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>
                   (local_f8.container,local_e8,local_100 + tVar8 + (ulong)(tVar7 + 1),
                    (anon_class_64_8_e6ffa566 *)&write);
    goto LAB_001cc77c;
  }
  tVar7 = to_unsigned<int>(iVar13);
  lVar3.locale_ = local_c8.locale_;
  lVar17 = tVar7 + local_100;
  _pointy = uVar14 - iVar12;
  uVar11 = (uint)local_e0;
  if ((uVar11 >> 0x13 & 1) != 0) {
    lVar17 = lVar17 + 1;
    if ((char)local_e0 == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_001cc6e8;
    }
    else {
      _pointy = 1;
    }
    tVar7 = to_unsigned<int>(_pointy);
    lVar17 = lVar17 + (ulong)tVar7;
  }
LAB_001cc6e8:
  digit_grouping<char>::digit_grouping(&grouping,lVar3,(bool)((byte)(uVar11 >> 0x11) & 1));
  iVar6 = digit_grouping<char>::count_separators(&grouping,iVar12);
  tVar7 = to_unsigned<int>(iVar6);
  write._0_8_ = &sign;
  write.significand = (significand_type)&significand;
  write._16_8_ = &significand_size;
  write._24_8_ = local_f0;
  write._32_8_ = &grouping;
  bVar10.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>
                 (local_f8.container,local_e8,lVar17 + (ulong)tVar7,
                  (anon_class_72_9_0c6a3a8a *)&write);
LAB_001cc77c:
  std::__cxx11::string::~string((string *)&grouping);
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar10.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}